

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O3

ON_Curve * __thiscall ON_Extrusion::IsoCurve(ON_Extrusion *this,int dir,double c)

{
  ON_Line *this_00;
  double dVar1;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dVector T_00;
  ON_3dVector T_01;
  bool bVar2;
  int iVar3;
  ON_LineCurve *this_01;
  undefined4 extraout_var;
  ON_NurbsCurve *pOVar4;
  ON_3dVector *pOVar5;
  double dVar6;
  ON_3dVector T;
  ON_Xform xform0;
  ON_3dPoint P;
  ON_Xform local_1b8;
  ON_3dVector local_130;
  ON_Xform local_118;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  ON_Curve *this_02;
  
  if (this->m_profile != (ON_Curve *)0x0) {
    iVar3 = 1 - dir;
    if (this->m_bTransposed == false) {
      iVar3 = dir;
    }
    this_00 = &this->m_path;
    ON_Line::Tangent(&local_130,this_00);
    ON_Xform::ON_Xform(&local_118);
    ON_Xform::ON_Xform(&local_1b8);
    ON_Line::PointAt(&local_48,this_00,(this->m_t).m_t[0]);
    pOVar5 = this->m_N;
    if (this->m_bHaveN[0] == false) {
      pOVar5 = (ON_3dVector *)0x0;
    }
    P_00.y = local_48.y;
    P_00.x = local_48.x;
    P_00.z = local_48.z;
    T_00.y = local_130.y;
    T_00.x = local_130.x;
    T_00.z = local_130.z;
    bVar2 = ON_GetEndCapTransformation
                      (P_00,T_00,this->m_up,pOVar5,&local_118,(ON_Xform *)0x0,(ON_Xform *)0x0);
    if (!bVar2) {
      return (ON_Curve *)0x0;
    }
    ON_Line::PointAt(&local_60,this_00,(this->m_t).m_t[1]);
    pOVar5 = this->m_N + 1;
    if (this->m_bHaveN[1] == false) {
      pOVar5 = (ON_3dVector *)0x0;
    }
    P_01.y = local_60.y;
    P_01.x = local_60.x;
    P_01.z = local_60.z;
    T_01.y = local_130.y;
    T_01.x = local_130.x;
    T_01.z = local_130.z;
    bVar2 = ON_GetEndCapTransformation
                      (P_01,T_01,this->m_up,pOVar5,&local_1b8,(ON_Xform *)0x0,(ON_Xform *)0x0);
    if (!bVar2) {
      return (ON_Curve *)0x0;
    }
    if (iVar3 == 0) {
      dVar1 = ON_Interval::NormalizedParameterAt(&this->m_path_domain,c);
      dVar6 = 1.0 - dVar1;
      local_1b8.m_xform[0][0] = local_118.m_xform[0][0] * dVar6 + local_1b8.m_xform[0][0] * dVar1;
      local_1b8.m_xform[0][1] = local_118.m_xform[0][1] * dVar6 + local_1b8.m_xform[0][1] * dVar1;
      local_1b8.m_xform[0][2] = local_118.m_xform[0][2] * dVar6 + local_1b8.m_xform[0][2] * dVar1;
      local_1b8.m_xform[0][3] = local_118.m_xform[0][3] * dVar6 + local_1b8.m_xform[0][3] * dVar1;
      local_1b8.m_xform[1][0] = local_118.m_xform[1][0] * dVar6 + local_1b8.m_xform[1][0] * dVar1;
      local_1b8.m_xform[1][1] = local_118.m_xform[1][1] * dVar6 + local_1b8.m_xform[1][1] * dVar1;
      local_1b8.m_xform[1][2] = local_118.m_xform[1][2] * dVar6 + local_1b8.m_xform[1][2] * dVar1;
      local_1b8.m_xform[1][3] = local_118.m_xform[1][3] * dVar6 + local_1b8.m_xform[1][3] * dVar1;
      local_1b8.m_xform[2][0] = local_118.m_xform[2][0] * dVar6 + local_1b8.m_xform[2][0] * dVar1;
      local_1b8.m_xform[2][1] = local_118.m_xform[2][1] * dVar6 + local_1b8.m_xform[2][1] * dVar1;
      local_1b8.m_xform[2][2] = local_118.m_xform[2][2] * dVar6 + local_1b8.m_xform[2][2] * dVar1;
      local_1b8.m_xform[2][3] = local_118.m_xform[2][3] * dVar6 + local_1b8.m_xform[2][3] * dVar1;
      local_1b8.m_xform[3][0] = local_118.m_xform[3][0] * dVar6 + local_1b8.m_xform[3][0] * dVar1;
      local_1b8.m_xform[3][1] = local_118.m_xform[3][1] * dVar6 + local_1b8.m_xform[3][1] * dVar1;
      local_1b8.m_xform[3][2] = dVar6 * local_118.m_xform[3][2] + dVar1 * local_1b8.m_xform[3][2];
      local_1b8.m_xform[3][3] = dVar6 * local_118.m_xform[3][3] + dVar1 * local_1b8.m_xform[3][3];
      iVar3 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
      this_02 = (ON_Curve *)CONCAT44(extraout_var,iVar3);
      if (this_02 != (ON_Curve *)0x0) {
        (*(this_02->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this_02,3);
        iVar3 = (*(this_02->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(this_02);
        if ((char)iVar3 != '\0') {
          return this_02;
        }
        pOVar4 = ON_Curve::NurbsCurve(this_02,(ON_NurbsCurve *)0x0,0.0,(ON_Interval *)0x0);
        (*(this_02->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_02);
        if (pOVar4 == (ON_NurbsCurve *)0x0) {
          return (ON_Curve *)0x0;
        }
        (*(pOVar4->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x1c])
                  (pOVar4,&local_1b8);
        return &pOVar4->super_ON_Curve;
      }
    }
    else if (iVar3 == 1) {
      ON_Curve::PointAt(&local_78,this->m_profile,c);
      this_01 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve(this_01);
      dVar1 = (this->m_path_domain).m_t[1];
      (this_01->m_t).m_t[0] = (this->m_path_domain).m_t[0];
      (this_01->m_t).m_t[1] = dVar1;
      this_01->m_dim = 3;
      ON_Xform::operator*(&local_90,&local_118,&local_78);
      (this_01->m_line).from.z = local_90.z;
      (this_01->m_line).from.x = local_90.x;
      (this_01->m_line).from.y = local_90.y;
      ON_Xform::operator*(&local_90,&local_1b8,&local_78);
      (this_01->m_line).to.z = local_90.z;
      (this_01->m_line).to.x = local_90.x;
      (this_01->m_line).to.y = local_90.y;
      return &this_01->super_ON_Curve;
    }
  }
  return (ON_Curve *)0x0;
}

Assistant:

ON_Curve* ON_Extrusion::IsoCurve(
       int dir,
       double c
       ) const
{
  // dir 0 first parameter varies and second parameter is constant
  //       e.g., point on IsoCurve(0,c) at t is srf(t,c)
  //     1 first parameter is constant and second parameter varies
  //       e.g., point on IsoCurve(1,c) at t is srf(c,t)

  if ( !m_profile )
    return 0;

  if ( m_bTransposed )
    dir = 1-dir;
  const ON_3dVector T = m_path.Tangent();

  ON_Xform xform0, xform1;
  if ( !ON_GetEndCapTransformation(m_path.PointAt(m_t.m_t[0]),T,m_up,m_bHaveN[0]?&m_N[0]:0,xform0,0,0) )
    return 0;
  if ( !ON_GetEndCapTransformation(m_path.PointAt(m_t.m_t[1]),T,m_up,m_bHaveN[1]?&m_N[1]:0,xform1,0,0) )
    return 0;

  ON_Curve*  isocurve = 0;
  if ( 1 == dir )
  {
    ON_3dPoint P = m_profile->PointAt(c);
    ON_LineCurve* line_curve = new ON_LineCurve();
    line_curve->m_t = m_path_domain;
    line_curve->m_dim = 3;
    line_curve->m_line.from = xform0*P;
    line_curve->m_line.to = xform1*P;
    isocurve = line_curve;
  }
  else if ( 0 == dir )
  {
    double s1 = m_path_domain.NormalizedParameterAt(c);
    const double s0 = 1.0-s1;
    xform1.m_xform[0][0] = s0*xform0.m_xform[0][0] + s1*xform1.m_xform[0][0];
    xform1.m_xform[0][1] = s0*xform0.m_xform[0][1] + s1*xform1.m_xform[0][1];
    xform1.m_xform[0][2] = s0*xform0.m_xform[0][2] + s1*xform1.m_xform[0][2];
    xform1.m_xform[0][3] = s0*xform0.m_xform[0][3] + s1*xform1.m_xform[0][3];

    xform1.m_xform[1][0] = s0*xform0.m_xform[1][0] + s1*xform1.m_xform[1][0];
    xform1.m_xform[1][1] = s0*xform0.m_xform[1][1] + s1*xform1.m_xform[1][1];
    xform1.m_xform[1][2] = s0*xform0.m_xform[1][2] + s1*xform1.m_xform[1][2];
    xform1.m_xform[1][3] = s0*xform0.m_xform[1][3] + s1*xform1.m_xform[1][3];

    xform1.m_xform[2][0] = s0*xform0.m_xform[2][0] + s1*xform1.m_xform[2][0];
    xform1.m_xform[2][1] = s0*xform0.m_xform[2][1] + s1*xform1.m_xform[2][1];
    xform1.m_xform[2][2] = s0*xform0.m_xform[2][2] + s1*xform1.m_xform[2][2];
    xform1.m_xform[2][3] = s0*xform0.m_xform[2][3] + s1*xform1.m_xform[2][3];

    xform1.m_xform[3][0] = s0*xform0.m_xform[3][0] + s1*xform1.m_xform[3][0];
    xform1.m_xform[3][1] = s0*xform0.m_xform[3][1] + s1*xform1.m_xform[3][1];
    xform1.m_xform[3][2] = s0*xform0.m_xform[3][2] + s1*xform1.m_xform[3][2];
    xform1.m_xform[3][3] = s0*xform0.m_xform[3][3] + s1*xform1.m_xform[3][3];

    isocurve = m_profile->DuplicateCurve();
    if ( isocurve )
    {
      isocurve->ChangeDimension(3);
      if ( !isocurve->Transform(xform1) )
      {
        // isocurve is probably a circle
        ON_NurbsCurve* nurbs_curve = isocurve->NurbsCurve();
        delete isocurve;
        isocurve = nurbs_curve;
        nurbs_curve = 0;
        if ( isocurve )
          isocurve->Transform(xform1);
      }
    }
  }

  return isocurve;
}